

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O2

Variable * __thiscall soul::BlockBuilder::createRegisterVariable(BlockBuilder *this,Type *type)

{
  Variable *pVVar1;
  Identifier local_30;
  Type local_28;
  
  local_28.category = type->category;
  local_28.arrayElementCategory = type->arrayElementCategory;
  local_28.isRef = type->isRef;
  local_28.isConstant = type->isConstant;
  local_28.primitiveType.type = (type->primitiveType).type;
  local_28.boundingSize = type->boundingSize;
  local_28.arrayElementBoundingSize = type->arrayElementBoundingSize;
  local_28.structure.object = (type->structure).object;
  (type->structure).object = (Structure *)0x0;
  local_30.name = (string *)0x0;
  pVVar1 = createVariable<soul::Identifier>(this,&local_28,&local_30,constant);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_28.structure);
  return pVVar1;
}

Assistant:

virtual ~BlockBuilder() {}